

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

string * __thiscall
Diligent::UnrollShaderIncludes_abi_cxx11_
          (string *__return_storage_ptr__,Diligent *this,ShaderCreateInfo *ShaderCI)

{
  long lVar1;
  undefined8 *puVar2;
  byte bVar3;
  ShaderCreateInfo in_stack_ffffffffffffff18;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Includes;
  
  bVar3 = 0;
  Includes._M_h._M_buckets = &Includes._M_h._M_single_bucket;
  Includes._M_h._M_bucket_count = 1;
  Includes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includes._M_h._M_element_count = 0;
  Includes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includes._M_h._M_rehash_policy._M_next_resize = 0;
  Includes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (*(long *)this != 0) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<char_const*const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&Includes,this);
  }
  puVar2 = (undefined8 *)&stack0xffffffffffffff18;
  for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar2 = *(undefined8 *)this;
    this = this + (ulong)bVar3 * -0x10 + 8;
    puVar2 = puVar2 + (ulong)bVar3 * -2 + 1;
  }
  UnrollShaderIncludesImpl(__return_storage_ptr__,in_stack_ffffffffffffff18,&Includes);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&Includes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::string UnrollShaderIncludes(const ShaderCreateInfo& ShaderCI) noexcept(false)
{
    std::unordered_set<std::string> Includes;
    if (ShaderCI.FilePath != nullptr)
        Includes.emplace(ShaderCI.FilePath);

    try
    {
        return UnrollShaderIncludesImpl(ShaderCI, Includes);
    }
    catch (const std::pair<std::string, std::string>& ErrInfo)
    {
        LOG_ERROR_AND_THROW("Failed to unroll includes in ", ErrInfo.first, ": ", ErrInfo.second);
        return "";
    }
    // Let other exceptions (e.g. 'Failed to load shader source file...') pass through
}